

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sz_decompress_3d.cpp
# Opt level: O3

void prediction_and_decompression_2d_with_border_prediction<float>
               (DSize_2d *size,meanInfo<float> *mean_info,double precision,int intv_radius,
               float *reg_params,uchar *indicator,int *type,float *unpredictable_data_pos,
               float *dec_data)

{
  size_t sVar1;
  size_t sVar2;
  size_t __n;
  bool bVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  size_t sVar7;
  ulong uVar8;
  size_t sVar9;
  size_t sVar10;
  int iVar11;
  void *__dest;
  long lVar12;
  size_t sVar13;
  long lVar14;
  size_t sVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  int iVar20;
  int iVar21;
  uchar *puVar22;
  void *pvVar23;
  int iVar24;
  float *pfVar25;
  float *pfVar26;
  float fVar27;
  float *local_c8;
  uchar *local_90;
  
  local_c8 = dec_data;
  uVar6 = size->d2;
  iVar4 = size->block_size;
  lVar14 = (long)iVar4;
  __n = uVar6 * 4 + 4;
  __dest = calloc(1,(lVar14 + 1) * __n);
  sVar7 = size->num_x;
  if (sVar7 != 0) {
    lVar12 = uVar6 + 1;
    uVar8 = size->d1;
    sVar9 = size->num_y;
    sVar10 = size->dim0_offset;
    sVar13 = 0;
    local_90 = indicator;
    do {
      sVar1 = sVar13 + 1;
      if (sVar9 != 0) {
        iVar20 = (int)uVar8 - (int)sVar13 * iVar4;
        if (sVar1 * lVar14 < uVar8) {
          iVar20 = iVar4;
        }
        sVar13 = size->dim0_offset;
        sVar15 = 0;
        puVar22 = local_90;
        pvVar23 = __dest;
        pfVar25 = local_c8;
        do {
          sVar2 = sVar15 + 1;
          iVar11 = (int)uVar6 - (int)sVar15 * iVar4;
          if (sVar2 * lVar14 < uVar6) {
            iVar11 = iVar4;
          }
          lVar17 = (long)iVar11;
          if (*puVar22 == '\0') {
            if (0 < iVar20) {
              lVar18 = (long)pvVar23 + lVar12 * 4 + 4;
              lVar16 = (long)pvVar23 + 4;
              iVar21 = 0;
              pfVar26 = pfVar25;
              do {
                if (0 < iVar11) {
                  bVar3 = mean_info->use_mean;
                  lVar19 = 0;
                  iVar24 = iVar11;
                  do {
                    iVar5 = *(int *)((long)type + lVar19);
                    if (iVar5 == 1) {
                      if ((bVar3 & 1U) == 0) goto LAB_00106c26;
                      fVar27 = mean_info->mean;
                    }
                    else if (iVar5 == 0) {
                      fVar27 = *unpredictable_data_pos;
                      unpredictable_data_pos = unpredictable_data_pos + 1;
                    }
                    else {
LAB_00106c26:
                      fVar27 = (float)((double)((iVar5 - intv_radius) * 2) * precision +
                                      (double)((*(float *)(lVar18 + -4 + lVar19) +
                                               *(float *)(lVar16 + lVar19)) -
                                              *(float *)(lVar16 + -4 + lVar19)));
                    }
                    *(float *)((long)pfVar26 + lVar19) = fVar27;
                    *(float *)(lVar18 + lVar19) = fVar27;
                    lVar19 = lVar19 + 4;
                    iVar24 = iVar24 + -1;
                  } while (iVar24 != 0);
                  type = (int *)((long)type + lVar19);
                  pfVar26 = (float *)((long)pfVar26 + lVar19);
                }
                pfVar26 = pfVar26 + (sVar13 - lVar17);
                iVar21 = iVar21 + 1;
                lVar18 = lVar18 + __n;
                lVar16 = lVar16 + __n;
              } while (iVar21 != iVar20);
            }
          }
          else {
            if (0 < iVar20) {
              lVar16 = (long)pvVar23 + lVar12 * 4 + 4;
              iVar21 = 0;
              pfVar26 = pfVar25;
              do {
                if (0 < iVar11) {
                  lVar18 = 0;
                  lVar19 = 0;
                  do {
                    if (type[lVar19] == 0) {
                      fVar27 = *unpredictable_data_pos;
                      unpredictable_data_pos = unpredictable_data_pos + 1;
                    }
                    else {
                      fVar27 = (float)((double)((type[lVar19] - intv_radius) * 2) * precision +
                                      (double)(*reg_params * (float)iVar21 +
                                               (float)(int)lVar19 * reg_params[1] + reg_params[2]));
                    }
                    pfVar26[lVar19] = fVar27;
                    *(float *)(lVar16 + lVar19 * 4) = fVar27;
                    lVar19 = lVar19 + 1;
                    lVar18 = lVar18 + -4;
                  } while (iVar11 != (int)lVar19);
                  type = (int *)((long)type - lVar18);
                  pfVar26 = (float *)((long)pfVar26 - lVar18);
                }
                pfVar26 = pfVar26 + (sVar13 - lVar17);
                iVar21 = iVar21 + 1;
                lVar16 = lVar16 + __n;
              } while (iVar21 != iVar20);
            }
            reg_params = reg_params + 3;
          }
          pfVar25 = pfVar25 + lVar17;
          pvVar23 = (void *)((long)pvVar23 + lVar17 * 4);
          puVar22 = puVar22 + 1;
          sVar15 = sVar2;
        } while (sVar2 != sVar9);
        local_90 = local_90 + sVar9;
      }
      memcpy(__dest,(void *)((long)__dest + lVar12 * lVar14 * 4),__n);
      local_c8 = local_c8 + sVar10 * lVar14;
      sVar13 = sVar1;
    } while (sVar1 != sVar7);
  }
  free(__dest);
  return;
}

Assistant:

void
prediction_and_decompression_2d_with_border_prediction(const DSize_2d& size, const meanInfo<T>& mean_info, double precision,
	int intv_radius, const float * reg_params, const unsigned char * indicator, 
	const int * type, const T * unpredictable_data_pos, T * dec_data){
	const int * type_pos = type;
	const unsigned char * indicator_pos = indicator;
	const float * reg_params_pos = reg_params;
	size_t buffer_dim0_offset = size.d2 + 1;
	T * pred_buffer = (T *) malloc((size.block_size+1)*(size.d2+1)*sizeof(T));
	memset(pred_buffer, 0, (size.block_size+1)*(size.d2+1)*sizeof(T));
	T * x_data_pos = dec_data;
	for(size_t i=0; i<size.num_x; i++){
		T * y_data_pos = x_data_pos;
		T * pred_buffer_pos = pred_buffer;
		for(size_t j=0; j<size.num_y; j++){
			int size_x = ((i+1)*size.block_size < size.d1) ? size.block_size : size.d1 - i*size.block_size;
			int size_y = ((j+1)*size.block_size < size.d2) ? size.block_size : size.d2 - j*size.block_size;
			if(*indicator_pos){
				// regression
				block_pred_and_decompress_regression_2d_with_buffer(reg_params_pos, pred_buffer_pos, precision, intv_radius, 
					size_x, size_y, buffer_dim0_offset, size.dim0_offset, type_pos, unpredictable_data_pos, y_data_pos);
				reg_params_pos += RegCoeffNum2d;
			}
			else{
				// Lorenzo
				block_pred_and_decompress_lorenzo_2d(mean_info, pred_buffer_pos, precision, intv_radius, size_x, size_y, 
						buffer_dim0_offset, size.dim0_offset, type_pos, unpredictable_data_pos, y_data_pos);
			}
			y_data_pos += size_y;
			pred_buffer_pos += size_y;
			indicator_pos ++;
		}
		memcpy(pred_buffer, pred_buffer + size.block_size*buffer_dim0_offset, buffer_dim0_offset*sizeof(T));
		x_data_pos += size.block_size*size.dim0_offset;
	}
	free(pred_buffer);
}